

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

void Abc_NodeSuperChoiceCollect2_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vVolume)

{
  if ((*(uint *)&pObj->field_0x14 & 0x40) != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
  if ((pObj->vFanins).nSize == 2) {
    Abc_NodeSuperChoiceCollect2_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vVolume);
    Abc_NodeSuperChoiceCollect2_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],vVolume);
    Vec_PtrPush(vVolume,pObj);
    return;
  }
  __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                ,0x18c,"void Abc_NodeSuperChoiceCollect2_rec(Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NodeSuperChoiceCollect2_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vVolume )
{
    if ( pObj->fMarkC )
        return;
    pObj->fMarkC = 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    Abc_NodeSuperChoiceCollect2_rec( Abc_ObjFanin0(pObj), vVolume );
    Abc_NodeSuperChoiceCollect2_rec( Abc_ObjFanin1(pObj), vVolume );
    Vec_PtrPush( vVolume, pObj );
}